

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

double llvm::frexp(double __x,int *__exponent)

{
  bool bVar1;
  fltSemantics *pfVar2;
  APFloat *in_RSI;
  double __x_00;
  double extraout_XMM0_Qa;
  double __x_01;
  double extraout_XMM0_Qa_00;
  double dVar3;
  DoubleAPFloat local_50;
  IEEEFloat local_40;
  roundingMode RM_local;
  int *Exp_local;
  APFloat *X_local;
  
  Exp_local = (int *)in_RSI;
  X_local = (APFloat *)__exponent;
  pfVar2 = APFloat::getSemantics(in_RSI);
  bVar1 = APFloat::usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    detail::frexp(__x_00,(int *)&local_40);
    pfVar2 = APFloat::getSemantics((APFloat *)Exp_local);
    APFloat::APFloat((APFloat *)__exponent,&local_40,pfVar2);
    detail::IEEEFloat::~IEEEFloat(&local_40);
    dVar3 = extraout_XMM0_Qa;
  }
  else {
    pfVar2 = APFloat::getSemantics((APFloat *)Exp_local);
    bVar1 = APFloat::usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x4ba);
    }
    detail::frexp(__x_01,(int *)&local_50);
    pfVar2 = APFloat::getSemantics((APFloat *)Exp_local);
    APFloat::APFloat((APFloat *)__exponent,&local_50,pfVar2);
    detail::DoubleAPFloat::~DoubleAPFloat(&local_50);
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

inline APFloat frexp(const APFloat &X, int &Exp, APFloat::roundingMode RM) {
  if (APFloat::usesLayout<detail::IEEEFloat>(X.getSemantics()))
    return APFloat(frexp(X.U.IEEE, Exp, RM), X.getSemantics());
  if (APFloat::usesLayout<detail::DoubleAPFloat>(X.getSemantics()))
    return APFloat(frexp(X.U.Double, Exp, RM), X.getSemantics());
  llvm_unreachable("Unexpected semantics");
}